

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O1

void __thiscall
TimedMutexTest_TryLockForTimeout_Test<yamc::posix::rwlock>::TestBody
          (TimedMutexTest_TryLockForTimeout_Test<yamc::posix::rwlock> *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  join_thread thd;
  timespec abs_timeout;
  barrier step;
  duration<long,_std::ratio<1L,_1000000000L>_> local_110;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  undefined8 *local_100;
  AssertHelper local_f8;
  thread local_f0;
  undefined1 local_e8 [32];
  pthread_rwlock_t local_c8;
  barrier local_88;
  
  local_88.nthread_ = 2;
  local_88.count_ = 2;
  local_88.step_ = 0;
  std::condition_variable::condition_variable(&local_88.cv_);
  local_88.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_88.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_88.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_88.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_88.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  local_e8._0_8_ = &local_c8;
  local_c8._48_8_ = 0;
  local_c8.__data.__pad1 = 0;
  local_c8.__data.__pad2 = 0;
  local_c8._16_8_ = 0;
  local_c8._24_8_ = 0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_e8._8_8_ = &local_88;
  std::thread::
  thread<TimedMutexTest_TryLockForTimeout_Test<yamc::posix::rwlock>::TestBody()::_lambda()_1_,,void>
            (&local_f0,(anon_class_16_2_20c777b2_for__M_head_impl *)local_e8);
  yamc::test::barrier::await(&local_88);
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar5 = std::chrono::_V2::system_clock::now();
  local_e8._0_8_ = (lVar5 + 300000000) / 1000000000;
  local_e8._8_8_ = local_e8._0_8_ * -1000000000 + lVar5 + 300000000;
  iVar3 = pthread_rwlock_timedwrlock(&local_c8,(timespec *)local_e8);
  local_108._M_head_impl._0_1_ = iVar3 != 0;
  local_100 = (undefined8 *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_108,
               (AssertionResult *)"mtx.try_lock_for(std::chrono::milliseconds(300))","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x135,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((TypeParam *)local_e8._0_8_ != (TypeParam *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_);
    }
    if ((long *)local_110.__r != (long *)0x0) {
      (**(code **)(*(long *)local_110.__r + 8))();
    }
  }
  puVar1 = local_100;
  if (local_100 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_100 != local_100 + 2) {
      operator_delete((undefined8 *)*local_100);
    }
    operator_delete(puVar1);
  }
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12c;
  lVar5 = std::chrono::_V2::steady_clock::now();
  local_110.__r = (lVar5 - lVar4) / 1000;
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)local_e8,"std::chrono::milliseconds(300)","sw.elapsed()",
             (duration<long,_std::ratio<1L,_1000L>_> *)&local_108,&local_110);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if ((barrier *)local_e8._8_8_ == (barrier *)0x0) {
      message = "";
    }
    else {
      message = (char *)*(size_t *)local_e8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x136,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  uVar2 = local_e8._8_8_;
  if ((barrier *)local_e8._8_8_ != (barrier *)0x0) {
    if ((size_t *)*(size_t *)local_e8._8_8_ != (size_t *)(local_e8._8_8_ + 0x10)) {
      operator_delete((undefined1 *)*(size_t *)local_e8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  yamc::test::barrier::await(&local_88);
  yamc::test::join_thread::~join_thread((join_thread *)&local_f0);
  pthread_rwlock_destroy(&local_c8);
  std::condition_variable::~condition_variable(&local_88.cv_);
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockForTimeout)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    yamc::test::stopwatch<std::chrono::steady_clock> sw;
    EXPECT_FALSE(mtx.try_lock_for(TEST_EXPECT_TIMEOUT));
    EXPECT_LE(TEST_EXPECT_TIMEOUT, sw.elapsed());
    step.await();  // b2
  }
}